

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_factory.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuParamTestFactory<iu_DISABLED_TestPFailure_x_iutest_x_Test_Test>::
~iuParamTestFactory(iuParamTestFactory<iu_DISABLED_TestPFailure_x_iutest_x_Test_Test> *this)

{
  iuParamTestFactory<iu_DISABLED_TestPFailure_x_iutest_x_Test_Test> *this_local;
  
  ~iuParamTestFactory(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

class iuParamTestFactory IUTEST_CXX_FINAL : public iuParamTestFactoryBase<typename Tester::ParamType>
{
    typedef typename Tester::ParamType ParamType;
    typedef iuParamTestFactoryBase<ParamType> _Mybase;
public:
    iuParamTestFactory() IUTEST_CXX_DEFAULT_FUNCTION
    explicit iuParamTestFactory(ParamType param) : _Mybase(param) {}

public:
    virtual auto_ptr<Test> Create() IUTEST_CXX_OVERRIDE
    {
        Tester::SetParam(&this->m_param);
        auto_ptr<Test> p( new Tester() );
        return p;
    }